

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O2

void __thiscall
optimization::graph_color::Conflict_Map::Conflict_Map
          (Conflict_Map *this,
          shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
          *color_map,MirFunction *func,u_int color_num)

{
  _Rb_tree_header *p_Var1;
  Function *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  long lVar3;
  size_type sVar4;
  _Rb_tree_node_base *p_Var5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  uint32_t uVar9;
  Function *pFVar10;
  char *tag;
  allocator<char> local_1aa;
  allocator<char> local_1a9;
  _Base_ptr local_1a8;
  allocator<char> local_199;
  Conflict_Map *local_198;
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  *local_190;
  _Base_ptr local_188;
  VarId var_1;
  undefined **local_170;
  undefined8 local_168;
  undefined1 local_160;
  undefined1 local_158 [64];
  undefined1 local_118 [88];
  string local_c0;
  VarId local_a0;
  undefined1 local_90 [24];
  undefined1 local_78 [8];
  VarId local_70;
  VarId var;
  
  p_Var1 = &(this->static_Map)._M_t._M_impl.super__Rb_tree_header;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158._40_8_ = &(this->merged_Map)._M_t._M_impl.super__Rb_tree_header;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_158._40_8_;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)local_158._40_8_;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190 = &this->merged_var_Map;
  p_Var1 = &(this->edge_vars)._M_t._M_impl.super__Rb_tree_header;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158._32_8_ = &this->remove_Nodes;
  std::stack<mir::inst::VarId,std::deque<mir::inst::VarId,std::allocator<mir::inst::VarId>>>::
  stack<std::deque<mir::inst::VarId,std::allocator<mir::inst::VarId>>,void>
            ((stack<mir::inst::VarId,_std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
              *)local_158._32_8_);
  std::
  __shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&(this->color_map).
                  super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ,&color_map->
                   super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  (this->unused_colors).
  super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->unused_colors).
  super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = &(this->priority_map)._M_t._M_impl.super__Rb_tree_header;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->func = func;
  this->color_num = color_num;
  local_198 = this;
  std::make_shared<std::set<int,std::less<int>,std::allocator<int>>>();
  __r = (Function *)(local_158 + 0x40);
  pFVar10 = __r;
  std::__shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(this->unused_colors).
               super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              ,(__shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                *)__r);
  this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  for (local_118._0_4_ = 0; (uint)local_118._0_4_ < color_num; local_118._0_4_ = local_118._0_4_ + 1
      ) {
    pFVar10 = __r;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               (this->unused_colors).
               super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(int *)__r);
  }
  if ((func->variables)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    iVar2 = 0xffff;
  }
  else {
    lVar3 = std::_Rb_tree_decrement(&(func->variables)._M_t._M_impl.super__Rb_tree_header._M_header)
    ;
    iVar2 = *(int *)(lVar3 + 0x20);
  }
  local_198->varId = iVar2;
  p_Var7 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_158._48_8_ = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header;
  do {
    if (p_Var7 == (_Base_ptr)local_158._48_8_) {
      for (p_Var7 = (local_198->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var7 != (_Base_ptr)local_158._40_8_; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)
          ) {
        var_1.super_Displayable._vptr_Displayable =
             var_1.super_Displayable._vptr_Displayable & 0xffffffffffffff00;
        AixLog::operator<<((ostream *)&var_1,(Severity *)pFVar10);
        AixLog::Tag::Tag((Tag *)&var);
        AixLog::operator<<((ostream *)&var,(Tag *)pFVar10);
        local_168 = std::chrono::_V2::system_clock::now();
        local_170 = &PTR__Timestamp_001d8f28;
        local_160 = 0;
        AixLog::operator<<((ostream *)&local_170,(Timestamp *)pFVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_158,"Conflict_Map",&local_1aa);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                   ,&local_1a9);
        pFVar10 = (Function *)local_158;
        AixLog::Function::Function((Function *)(local_158 + 0x40),(string *)pFVar10,&local_c0,0x52);
        AixLog::operator<<((ostream *)(local_158 + 0x40),pFVar10);
        (*(code *)**(undefined8 **)(p_Var7 + 1))(p_Var7 + 1,&std::clog);
        tag = " representes these vars : ";
        std::operator<<((ostream *)&std::clog," representes these vars : ");
        AixLog::Function::~Function((Function *)(local_158 + 0x40));
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)local_158);
        AixLog::Tag::~Tag((Tag *)&var);
        local_1a8 = (_Base_ptr)&p_Var7[1]._M_right;
        local_188 = p_Var7;
        for (p_Var8 = p_Var7[2]._M_parent; p_Var8 != local_1a8;
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
          var_1.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          var_1.id = *(uint32_t *)&p_Var8[1]._M_parent;
          local_1aa = (allocator<char>)0x0;
          AixLog::operator<<((ostream *)&local_1aa,(Severity *)tag);
          AixLog::Tag::Tag((Tag *)&var);
          AixLog::operator<<((ostream *)&var,(Tag *)tag);
          local_168 = std::chrono::_V2::system_clock::now();
          local_170 = &PTR__Timestamp_001d8f28;
          local_160 = 0;
          AixLog::operator<<((ostream *)&local_170,(Timestamp *)tag);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_158,"Conflict_Map",&local_1a9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                     ,&local_199);
          pFVar10 = (Function *)local_158;
          AixLog::Function::Function
                    ((Function *)(local_158 + 0x40),(string *)pFVar10,&local_c0,0x54);
          AixLog::operator<<((ostream *)(local_158 + 0x40),pFVar10);
          (**var_1.super_Displayable._vptr_Displayable)(&var_1,&std::clog);
          tag = ", ";
          std::operator<<((ostream *)&std::clog,", ");
          AixLog::Function::~Function((Function *)(local_158 + 0x40));
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)local_158);
          AixLog::Tag::~Tag((Tag *)&var);
        }
        var_1.super_Displayable._vptr_Displayable =
             var_1.super_Displayable._vptr_Displayable & 0xffffffffffffff00;
        AixLog::operator<<((ostream *)&var_1,(Severity *)tag);
        AixLog::Tag::Tag((Tag *)&var);
        p_Var7 = local_188;
        AixLog::operator<<((ostream *)&var,(Tag *)tag);
        local_168 = std::chrono::_V2::system_clock::now();
        local_170 = &PTR__Timestamp_001d8f28;
        local_160 = 0;
        AixLog::operator<<((ostream *)&local_170,(Timestamp *)tag);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_158,"Conflict_Map",&local_1aa);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                   ,&local_1a9);
        pFVar10 = (Function *)local_158;
        AixLog::Function::Function((Function *)(local_158 + 0x40),(string *)pFVar10,&local_c0,0x56);
        AixLog::operator<<((ostream *)(local_158 + 0x40),pFVar10);
        std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
        AixLog::Function::~Function((Function *)(local_158 + 0x40));
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)local_158);
        AixLog::Tag::~Tag((Tag *)&var);
      }
      return;
    }
    local_188 = p_Var7[3]._M_left;
    p_Var8 = p_Var7[3]._M_parent;
    local_158._56_8_ = p_Var7;
    while (p_Var8 != local_188) {
      local_1a8 = p_Var8;
      iVar2 = (**(code **)(**(long **)p_Var8 + 8))();
      if (iVar2 == 7) {
        (**(code **)(**(long **)local_1a8 + 0x10))(local_158 + 0x40);
        for (p_Var5 = (_Rb_tree_node_base *)local_118._24_8_;
            p_Var5 != (_Rb_tree_node_base *)this_00;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          var.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          var.id = *(uint32_t *)&p_Var5[1]._M_parent;
          sVar4 = std::
                  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                  ::count(local_190,&var);
          if (sVar4 != 0) {
            pmVar6 = std::
                     map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                     ::at(local_190,&var);
            uVar9 = pmVar6->id;
            goto LAB_0013535f;
          }
        }
        uVar9 = 0;
LAB_0013535f:
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                     *)(local_158 + 0x40));
        p_Var7 = local_1a8;
        if (uVar9 == 0) {
          sVar4 = std::
                  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                  ::count(local_190,(key_type *)(*(long *)local_1a8 + 8));
          p_Var7 = local_1a8;
          if (sVar4 == 0) {
            uVar9 = local_198->varId + 1;
            local_198->varId = uVar9;
          }
          else {
            pmVar6 = std::
                     map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                     ::at(local_190,(key_type *)(*(long *)local_1a8 + 8));
            uVar9 = pmVar6->id;
          }
        }
        local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
        local_70.id = *(uint32_t *)(*(long *)p_Var7 + 0x10);
        local_90._16_8_ = &PTR_display_001d90d0;
        local_78._0_4_ = uVar9;
        merge(local_198,&local_70,(VarId *)(local_90 + 0x10));
        pFVar10 = *(Function **)p_Var7;
        (*(code *)(((element_type *)pFVar10->_vptr_Function)->_M_t)._M_impl.super__Rb_tree_header.
                  _M_header._M_parent)(local_158 + 0x40);
        for (p_Var5 = (_Rb_tree_node_base *)local_118._24_8_;
            p_Var5 != (_Rb_tree_node_base *)this_00;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          local_90._8_4_ = *(undefined4 *)&p_Var5[1]._M_parent;
          local_90._0_8_ = &PTR_display_001d90d0;
          local_a0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          pFVar10 = (Function *)local_90;
          local_a0.id = uVar9;
          merge(local_198,(VarId *)local_90,&local_a0);
        }
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                     *)(local_158 + 0x40));
        p_Var7 = (_Base_ptr)local_158._56_8_;
      }
      p_Var8 = (_Base_ptr)&local_1a8->_M_parent;
    }
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

Conflict_Map(std::shared_ptr<Color_Map> color_map,
               mir::inst::MirFunction& func, u_int color_num = 8)
      : color_num(color_num), color_map(color_map), func(func) {
    unused_colors = std::make_shared<std::set<int>>();
    for (int i = 0; i < color_num; i++) {
      unused_colors->insert(i);
    }
    if (func.variables.size()) {
      auto end_iter = func.variables.end();
      end_iter--;
      varId = end_iter->first;
    } else {
      varId = mir::inst::VarId(65535);
    }
    for (auto& blkiter : func.basic_blks) {
      for (auto& inst : blkiter.second.inst) {
        if (inst->inst_kind() == mir::inst::InstKind::Phi) {
          mir::inst::VarId new_VarId(0);
          for (auto var : inst->useVars()) {
            if (merged_var_Map.count(var)) {
              new_VarId = merged_var_Map.at(var);
              break;
            }
          }
          if (new_VarId.id == 0) {
            if (merged_var_Map.count(inst->dest)) {
              new_VarId = merged_var_Map.at(inst->dest);
            } else {
              new_VarId = get_new_VarId();
            }
          }
          merge(inst->dest, new_VarId);
          for (auto var : inst->useVars()) {
            merge(var, new_VarId);
          }
          // LOG(TRACE) << new_VarId << " : ";
          // for (auto var : inst->useVars()) {
          //   LOG(TRACE) << var << ", ";
          // }
          // LOG(TRACE) << std::endl;
        }
      }
    }
    for (auto& pair : merged_Map) {
      LOG(TRACE) << pair.first << " representes these vars : ";
      for (auto var : pair.second) {
        LOG(TRACE) << var << ", ";
      }
      LOG(TRACE) << std::endl;
    }
  }